

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHPublicKey.cpp
# Opt level: O2

bool __thiscall DHPublicKey::deserialise(DHPublicKey *this,ByteString *serialised)

{
  size_t sVar1;
  bool bVar2;
  ByteString dY;
  ByteString dG;
  ByteString dP;
  ByteString local_90;
  ByteString local_68;
  ByteString local_40;
  
  ByteString::chainDeserialise(&local_40,serialised);
  ByteString::chainDeserialise(&local_68,serialised);
  ByteString::chainDeserialise(&local_90,serialised);
  sVar1 = ByteString::size(&local_40);
  if (sVar1 != 0) {
    sVar1 = ByteString::size(&local_68);
    if (sVar1 != 0) {
      sVar1 = ByteString::size(&local_90);
      if (sVar1 != 0) {
        (**(code **)(*(long *)this + 0x30))(this,&local_40);
        (**(code **)(*(long *)this + 0x38))(this,&local_68);
        bVar2 = true;
        (**(code **)(*(long *)this + 0x40))(this,&local_90);
        goto LAB_0014c217;
      }
    }
  }
  bVar2 = false;
LAB_0014c217:
  ByteString::~ByteString(&local_90);
  ByteString::~ByteString(&local_68);
  ByteString::~ByteString(&local_40);
  return bVar2;
}

Assistant:

bool DHPublicKey::deserialise(ByteString& serialised)
{
	ByteString dP = ByteString::chainDeserialise(serialised);
	ByteString dG = ByteString::chainDeserialise(serialised);
	ByteString dY = ByteString::chainDeserialise(serialised);

	if ((dP.size() == 0) ||
	    (dG.size() == 0) ||
	    (dY.size() == 0))
	{
		return false;
	}

	setP(dP);
	setG(dG);
	setY(dY);

	return true;
}